

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall
QMenuBarPrivate::setCurrentAction
          (QMenuBarPrivate *this,QAction *action,bool popup,bool activateFirst)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QWidget *this_00;
  QAction *act;
  QMenuBarPrivate *this_01;
  ulong uVar4;
  byte in_CL;
  byte bVar5;
  byte in_DL;
  long in_RSI;
  QMenuBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QAction *previousAction;
  QMenu *menu;
  QWidget *fw;
  QMenuBar *q;
  QStatusTipEvent tip;
  QString empty;
  QAction *in_stack_ffffffffffffff38;
  QRect *in_stack_ffffffffffffff40;
  ActionEvent action_e;
  QWidget *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte bVar6;
  QMenuBarPrivate *in_stack_ffffffffffffff60;
  QWidget *local_90;
  QWidget *pQVar7;
  FocusReason reason;
  undefined6 in_stack_ffffffffffffff80;
  QStatusTipEvent local_70 [40];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 activateFirst_00;
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  activateFirst_00 = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = in_DL & 1;
  bVar2 = in_CL & 1;
  bVar3 = ::operator==((QPointer<QAction> *)in_stack_ffffffffffffff40,
                       (QAction **)in_stack_ffffffffffffff38);
  if ((!bVar3) || ((bVar5 & 1) != (in_RDI->field_0x2a0 & 1))) {
    QBasicTimer::stop();
    bVar6 = 0;
    if ((bVar5 & 1) != 0) {
      bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x65a9b0);
      bVar6 = bVar3 ^ 0xff;
    }
    in_RDI->doChildEffects = (bool)(bVar6 & 1);
    this_00 = &q_func(in_RDI)->super_QWidget;
    local_90 = (QWidget *)0x0;
    act = (QAction *)::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x65a9eb);
    if (act != (QAction *)0x0) {
      QPointer<QMenu>::operator=
                ((QPointer<QMenu> *)in_stack_ffffffffffffff40,(QMenu *)in_stack_ffffffffffffff38);
      if ((bVar5 & 1) != 0) {
        QWidget::window((QWidget *)CONCAT17(bVar6,in_stack_ffffffffffffff50));
        local_90 = QWidget::focusWidget((QWidget *)0x65aa26);
        QWidget::setFocus((QWidget *)CONCAT17(bVar5,CONCAT16(bVar2,in_stack_ffffffffffffff80)),
                          (FocusReason)((ulong)this_00 >> 0x20));
      }
      QWidget::hide((QWidget *)0x65aa44);
    }
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x65aa55);
    if (bVar3) {
      pQVar7 = this_00;
      ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x65aa76);
      actionRect(in_stack_ffffffffffffff60,act);
      QWidget::update(this_00,in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff48 = this_00;
      this_00 = pQVar7;
    }
    in_RDI->field_0x2a0 = in_RDI->field_0x2a0 & 0xfe | bVar5 & 1;
    this_01 = (QMenuBarPrivate *)
              ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x65aad4);
    QPointer<QAction>::operator=
              ((QPointer<QAction> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    action_e = (ActionEvent)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    if ((in_RSI == 0) || (uVar4 = QAction::isEnabled(), (uVar4 & 1) == 0)) {
      if (this_01 != (QMenuBarPrivate *)0x0) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x65abd6);
        memset(local_70,0xaa,0x28);
        QStatusTipEvent::QStatusTipEvent(local_70,(QString *)&local_48);
        QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_70);
        QStatusTipEvent::~QStatusTipEvent(local_70);
        QString::~QString((QString *)0x65ac22);
      }
      reason = (FocusReason)((ulong)this_00 >> 0x20);
    }
    else {
      activateAction((QMenuBarPrivate *)CONCAT17(bVar6,in_stack_ffffffffffffff50),
                     (QAction *)in_stack_ffffffffffffff48,action_e);
      if ((bVar5 & 1) != 0) {
        popupAction(in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,
                    (bool)activateFirst_00);
      }
      pQVar7 = this_00;
      actionRect(this_01,act);
      reason = (FocusReason)((ulong)pQVar7 >> 0x20);
      QWidget::update(in_stack_ffffffffffffff48,(QRect *)this_00);
    }
    if (local_90 != (QWidget *)0x0) {
      QWidget::setFocus((QWidget *)CONCAT17(bVar5,CONCAT16(bVar2,in_stack_ffffffffffffff80)),reason)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBarPrivate::setCurrentAction(QAction *action, bool popup, bool activateFirst)
{
    if (currentAction == action && popup == popupState)
        return;

    autoReleaseTimer.stop();

    doChildEffects = (popup && !activeMenu);
    Q_Q(QMenuBar);
    QWidget *fw = nullptr;
    if (QMenu *menu = activeMenu) {
        activeMenu = nullptr;
        if (popup) {
            fw = q->window()->focusWidget();
            q->setFocus(Qt::NoFocusReason);
        }
        menu->hide();
    }

    if (currentAction)
        q->update(actionRect(currentAction));

    popupState = popup;
#if QT_CONFIG(statustip)
    QAction *previousAction = currentAction;
#endif
    currentAction = action;
    if (action && action->isEnabled()) {
        activateAction(action, QAction::Hover);
        if (popup)
            popupAction(action, activateFirst);
        q->update(actionRect(action));
#if QT_CONFIG(statustip)
    }  else if (previousAction) {
        QString empty;
        QStatusTipEvent tip(empty);
        QCoreApplication::sendEvent(q, &tip);
#endif
    }
    if (fw)
        fw->setFocus(Qt::NoFocusReason);
}